

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTcSymMetaclass::gen_code(CTcSymMetaclass *this,int discard)

{
  undefined4 in_ESI;
  ulong in_RDI;
  uchar in_stack_000000df;
  CTcGenTarg *in_stack_000000e0;
  undefined4 in_stack_fffffffffffffff0;
  
  *(byte *)(in_RDI + 0x58) = *(byte *)(in_RDI + 0x58) & 0xfd | 2;
  CTcGenTarg::write_op(in_stack_000000e0,in_stack_000000df);
  CTcDataStream::write_obj_id((CTcDataStream *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDI);
  CTcGenTarg::note_push((CTcGenTarg *)0x2d945d);
  return;
}

Assistant:

void CTcSymMetaclass::gen_code(int discard)
{
    /* 
     *   mark it as referenced - if the metaclass wasn't defined in this file
     *   but was merely imported from a symbol file, we now need to write it
     *   to the object file anyway, since its class object ID has been
     *   referenced 
     */
    ref_ = TRUE;
    
    /* 
     *   the metaclass name refers to the IntrinsicClass instance
     *   associated with the metaclass 
     */
    G_cg->write_op(OPC_PUSHOBJ);
    G_cs->write_obj_id(class_obj_);

    /* note the push */
    G_cg->note_push();
}